

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  mapped_type *pmVar3;
  pointer __rhs;
  string local_d0;
  string prop;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string dest;
  
  if (itgen != (cmInstallTargetGenerator *)0x0) {
    bVar1 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config);
    if (bVar1) {
      this_00 = itgen->Target;
      cmInstallTargetGenerator::GetDestination(&dest,itgen,config);
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      bVar1 = cmsys::SystemTools::FileIsFullPath(dest._M_dataplus._M_p);
      if (!bVar1) {
        std::__cxx11::string::assign((char *)&value);
      }
      std::__cxx11::string::append((string *)&value);
      std::__cxx11::string::append((char *)&value);
      if (itgen->ImportLibrary == true) {
        std::__cxx11::string::string((string *)&prop,"IMPORTED_IMPLIB",(allocator *)&local_d0);
        std::__cxx11::string::append((string *)&prop);
        cmInstallTargetGenerator::GetInstallFilename(&local_d0,this_00,config,NameImplib);
        std::__cxx11::string::append((string *)&value);
        std::__cxx11::string::~string((string *)&local_d0);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prop);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)importedLocations,&prop);
      }
      else {
        TVar2 = cmGeneratorTarget::GetType(itgen->Target);
        if (TVar2 == OBJECT_LIBRARY) {
          std::__cxx11::string::string((string *)&prop,"IMPORTED_OBJECTS",(allocator *)&local_d0);
          std::__cxx11::string::append((string *)&prop);
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmInstallTargetGenerator::GetInstallObjectNames(itgen,config,&objects);
          for (__rhs = objects.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              __rhs != objects.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
            std::operator+(&local_d0,&value,__rhs);
            std::__cxx11::string::operator=((string *)__rhs,(string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_d0,&objects,";");
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&prop);
          std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)importedLocations,&prop);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&objects);
        }
        else {
          std::__cxx11::string::string((string *)&prop,"IMPORTED_LOCATION",(allocator *)&local_d0);
          std::__cxx11::string::append((string *)&prop);
          bVar1 = cmGeneratorTarget::IsAppBundleOnApple(this_00);
          if (bVar1) {
            cmInstallTargetGenerator::GetInstallFilename(&local_d0,this_00,config,NameNormal);
            std::__cxx11::string::append((string *)&value);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::append((char *)&value);
            cmInstallTargetGenerator::GetInstallFilename(&local_d0,this_00,config,NameNormal);
            std::__cxx11::string::append((string *)&value);
          }
          else {
            cmInstallTargetGenerator::GetInstallFilename(&local_d0,this_00,config,NameReal);
            std::__cxx11::string::append((string *)&value);
          }
          std::__cxx11::string::~string((string *)&local_d0);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&prop);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)importedLocations,&prop);
        }
      }
      std::__cxx11::string::~string((string *)&prop);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&dest);
    }
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest.c_str())) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = "IMPORTED_IMPLIB";
    prop += suffix;

    // Append the installed file name.
    value += itgen->GetInstallFilename(target, config,
                                       cmInstallTargetGenerator::NameImplib);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = "IMPORTED_OBJECTS";
    prop += suffix;

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::vector<std::string>::iterator i = objects.begin();
         i != objects.end(); ++i) {
      *i = value + *i;
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
    importedLocations.insert(prop);
  } else {
    // Construct the property name.
    std::string prop = "IMPORTED_LOCATION";
    prop += suffix;

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += itgen->GetInstallFilename(target, config);
      value += ".app/Contents/MacOS/";
      value += itgen->GetInstallFilename(target, config);
    } else {
      value += itgen->GetInstallFilename(target, config,
                                         cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}